

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findClique.cpp
# Opt level: O3

int maxClique(CGraphIO *gio,int l_bound,vector<int,_std::allocator<int>_> *max_clique_data)

{
  vector<int,_std::allocator<int>_> *ptrVtx;
  pointer piVar1;
  bool bVar2;
  int iVar3;
  void *__s;
  int *__args;
  uint idx;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int maxClq;
  vector<int,_std::allocator<int>_> max_clique_data_inter;
  vector<int,_std::allocator<int>_> U;
  uint local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_38 = max_clique_data;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_58,
             ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_78,
             ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
  std::vector<int,_std::allocator<int>_>::reserve
            (local_38,((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >>
                      0x20);
  pruned1 = 0;
  pruned2 = 0;
  pruned3 = 0;
  pruned5 = 0;
  iVar3 = (int)((ulong)((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar6 = iVar3 + -1;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar5 = (long)iVar6 * 4;
  }
  local_7c = l_bound;
  __s = operator_new__(uVar5);
  memset(__s,0,(long)iVar6 * 4);
  idx = iVar3 - 2;
  local_80 = idx;
  if (0 < iVar6) {
    ptrVtx = &gio->m_vi_Vertices;
    do {
      *(undefined4 *)((long)__s + (ulong)idx * 4) = 1;
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      local_80 = idx;
      iVar3 = getDegree(ptrVtx,idx);
      if (iVar3 < l_bound) {
        pruned1 = pruned1 + 1;
      }
      else {
        piVar1 = (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = piVar1[(int)local_80];
        lVar4 = (long)iVar3;
        if (iVar3 < piVar1[(long)(int)local_80 + 1]) {
          lVar7 = lVar4 * 4;
          do {
            iVar3 = *(int *)((long)(gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar7);
            if (*(int *)((long)__s + (long)iVar3 * 4) == 1) {
              pruned2 = pruned2 + 1;
            }
            else {
              iVar3 = getDegree(ptrVtx,iVar3);
              if (iVar3 < l_bound) {
                pruned3 = pruned3 + 1;
              }
              else {
                __args = (int *)((long)(gio->m_vi_Edges).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar7);
                if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_58,
                             (iterator)
                             local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,__args);
                }
                else {
                  *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = *__args;
                  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
            }
            lVar4 = lVar4 + 1;
            lVar7 = lVar7 + 4;
          } while (lVar4 < (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[(long)(int)local_80 + 1]);
        }
        maxCliqueHelper(gio,&local_58,1,&local_7c,&local_78);
        iVar3 = local_7c;
        if (l_bound < local_7c) {
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_78,
                       (iterator)
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_80);
          }
          else {
            *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_80;
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          std::vector<int,_std::allocator<int>_>::operator=(local_38,&local_78);
        }
        l_bound = iVar3;
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
      }
      idx = local_80 - 1;
      bVar2 = 0 < (int)local_80;
      local_80 = idx;
    } while (bVar2);
  }
  operator_delete__(__s);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return l_bound;
}

Assistant:

int maxClique( CGraphIO& gio, int l_bound, vector<int>& max_clique_data )
{
	vector <int>* ptrVertex = gio.GetVerticesPtr();
	vector <int>* ptrEdge = gio.GetEdgesPtr();
	vector <int> U;
   	U.reserve(gio.GetVertexCount());
   	vector<int> max_clique_data_inter;
   	max_clique_data_inter.reserve(gio.GetVertexCount());
   	max_clique_data.reserve(gio.GetVertexCount());
	int maxClq = l_bound;
   	int prev_maxClq;

	pruned1 = 0;
	pruned2 = 0;
	pruned3 = 0;
	pruned5 = 0;

	//Bit Vector to track if vertex has been considered previously.
	int *bitVec = new int[gio.GetVertexCount()];
	memset(bitVec, 0, gio.GetVertexCount() * sizeof(int));

	for(int i = gio.GetVertexCount()-1; i >= 0; i--)
	{
		bitVec[i] = 1;
      prev_maxClq = maxClq;

		U.clear();
		//Pruning 1
		if( getDegree(ptrVertex, i) < maxClq)
		{
			pruned1++;
			continue;
		}

		for( int j = (*ptrVertex)[i]; j < (*ptrVertex)[i + 1]; j++ )
		{	
			//Pruning 2
			if(bitVec[(*ptrEdge)[j]] != 1)
			{
				//Pruning 3
				if( getDegree(ptrVertex, (*ptrEdge)[j]) >=  maxClq )			
					U.push_back((*ptrEdge)[j]);
				else
					pruned3++;
			}
			else 
				pruned2++;
		}

		maxCliqueHelper( gio, &U, 1, maxClq, max_clique_data_inter );

      if(maxClq > prev_maxClq)
      {
         max_clique_data_inter.push_back(i);
         max_clique_data = max_clique_data_inter;
		}
		max_clique_data_inter.clear();
	}

   delete [] bitVec;
   max_clique_data_inter.clear();

#ifdef _DEBUG
	cout << "Pruning 1 = " << pruned1 << endl;
	cout << "Pruning 2 = " << pruned2 << endl;
	cout << "Pruning 3 = " << pruned3 << endl;
	cout << "Pruning 5 = " << pruned5 << endl;
#endif

		return maxClq;
}